

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmq.hpp
# Opt level: O1

__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __thiscall
rmq<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_unsigned_long>::
query(rmq<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_unsigned_long>
      *this,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> range_begin,
     __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> range_end)

{
  ulong uVar1;
  pointer pvVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int *piVar8;
  int *piVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int *piVar13;
  int iVar14;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var23;
  ulong uVar24;
  
  piVar9 = (this->_begin)._M_current;
  uVar21 = (long)range_begin._M_current - (long)piVar9 >> 2;
  uVar18 = (long)range_end._M_current - (long)piVar9 >> 2;
  if (uVar18 <= uVar21) {
    __assert_fail("begin_idx < end_idx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                  ,0xb5,
                  "Iterator rmq<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<int *, std::vector<int>>, index_t = unsigned long]"
                 );
  }
  if (this->n < uVar18) {
    __assert_fail("end_idx <= n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                  ,0xb6,
                  "Iterator rmq<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<int *, std::vector<int>>, index_t = unsigned long]"
                 );
  }
  uVar24 = uVar21 - 1;
  uVar1 = this->superblock_size;
  uVar20 = uVar24 / uVar1 + 1;
  if (piVar9 == range_begin._M_current) {
    uVar20 = 0;
  }
  uVar4 = uVar18 / uVar1;
  uVar5 = uVar4 - uVar20;
  _Var19._M_current = range_begin._M_current;
  if (uVar4 < uVar20 || uVar5 == 0) {
LAB_00106491:
    uVar5 = uVar20 - 1;
    if ((uVar5 < uVar4) && (uVar21 != uVar20 * uVar1)) {
      uVar11 = this->n_blocks_per_superblock;
      lVar6 = uVar24 / this->block_size + 1;
      uVar17 = this->block_size * lVar6;
      uVar7 = lVar6 - uVar11 * uVar5;
      if (uVar11 != uVar7) {
        uVar12 = ~uVar7 + uVar11;
        if (uVar12 == 0) {
          uVar10 = 0x40;
        }
        else {
          lVar6 = 0x3f;
          if (uVar12 != 0) {
            for (; uVar12 >> lVar6 == 0; lVar6 = lVar6 + -1) {
            }
          }
          uVar10 = (uint)lVar6 ^ 0x3f;
        }
        if (piVar9[(ulong)*(ushort *)
                           (uVar7 * 2 +
                            *(long *)&(this->block_mins).
                                      super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[0x40 - uVar10].
                                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                      ._M_impl.super__Vector_impl_data +
                           (uVar11 - (long)((1 << (-(char)uVar10 & 0x1fU)) / 2)) * uVar5 * 2) +
                   uVar5 * uVar1] < *_Var19._M_current) {
          _Var19._M_current =
               piVar9 + (ulong)*(ushort *)
                                (uVar7 * 2 +
                                 *(long *)&(this->block_mins).
                                           super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[0x40 - uVar10].
                                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                           ._M_impl.super__Vector_impl_data +
                                (uVar11 - (long)((1 << (-(char)uVar10 & 0x1fU)) / 2)) * uVar5 * 2) +
                        uVar5 * uVar1;
        }
      }
      if (uVar21 <= uVar17 && uVar17 - uVar21 != 0) {
        piVar8 = piVar9 + uVar17;
        piVar13 = range_begin._M_current + 1;
        _Var15._M_current = range_begin._M_current;
        _Var23._M_current = range_begin._M_current;
        if (piVar13 != piVar8 && piVar8 != range_begin._M_current) {
          do {
            _Var15._M_current = piVar13;
            if (*_Var23._M_current <= *piVar13) {
              _Var15._M_current = _Var23._M_current;
            }
            piVar13 = piVar13 + 1;
            _Var23._M_current = _Var15._M_current;
          } while (piVar13 != piVar8);
        }
        if (*_Var15._M_current < *_Var19._M_current) {
          _Var19._M_current = _Var15._M_current;
        }
      }
    }
    if (((uVar20 <= uVar4) && (uVar4 != this->n_superblocks)) &&
       (uVar11 = uVar4 * uVar1, uVar18 != uVar11)) {
      lVar6 = this->n_blocks_per_superblock * uVar4;
      uVar7 = uVar18 / this->block_size;
      uVar17 = uVar7 - lVar6;
      if (uVar17 != 0) {
        uVar12 = 0x3f;
        if (uVar17 != 0) {
          for (; uVar17 >> uVar12 == 0; uVar12 = uVar12 - 1) {
          }
        }
        iVar14 = 1 << ((byte)uVar12 & 0x1f);
        lVar22 = (long)(iVar14 / 2) * uVar4;
        lVar16 = *(long *)((long)&(((this->block_mins).
                                    super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  )._M_impl.super__Vector_impl_data +
                          ((uVar12 & 0xffffffff) * 3 & 0xffffffff) * 8);
        if (piVar9[*(ushort *)(lVar16 + (lVar6 - lVar22) * 2) + uVar11] < *_Var19._M_current) {
          _Var19._M_current = piVar9 + *(ushort *)(lVar16 + (lVar6 - lVar22) * 2) + uVar11;
        }
        if (piVar9[*(ushort *)(lVar16 + (uVar7 - (iVar14 + lVar22)) * 2) + uVar11] <
            *_Var19._M_current) {
          _Var19._M_current =
               piVar9 + *(ushort *)(lVar16 + (uVar7 - (iVar14 + lVar22)) * 2) + uVar11;
        }
      }
      uVar7 = uVar7 * this->block_size;
      if (uVar7 < uVar18) {
        piVar13 = piVar9 + uVar7;
        piVar8 = piVar9 + uVar7 + 1;
        if (piVar8 != range_end._M_current && piVar13 != range_end._M_current) {
          do {
            piVar3 = piVar8;
            if (*piVar13 <= *piVar8) {
              piVar3 = piVar13;
            }
            piVar13 = piVar3;
            piVar8 = piVar8 + 1;
          } while (piVar8 != range_end._M_current);
        }
        if (*piVar13 < *_Var19._M_current) {
          _Var19._M_current = piVar13;
        }
      }
    }
    if (uVar4 < uVar20) {
      uVar4 = this->block_size;
      uVar24 = uVar24 / uVar4 + 1;
      if (piVar9 == range_begin._M_current) {
        uVar24 = 0;
      }
      uVar11 = uVar18 / uVar4;
      uVar7 = uVar11 - uVar24;
      if (uVar11 < uVar24 || uVar7 == 0) {
        piVar9 = range_begin._M_current + 1;
        _Var15._M_current = range_begin._M_current;
        if (piVar9 != range_end._M_current && range_begin._M_current != range_end._M_current) {
          do {
            range_begin._M_current = piVar9;
            if (*_Var15._M_current <= *piVar9) {
              range_begin._M_current = _Var15._M_current;
            }
            piVar9 = piVar9 + 1;
            _Var15._M_current = range_begin._M_current;
          } while (piVar9 != range_end._M_current);
        }
        if (*range_begin._M_current < *_Var19._M_current) {
          _Var19._M_current = range_begin._M_current;
        }
      }
      else {
        if (uVar24 / this->n_blocks_per_superblock != uVar11 / this->n_blocks_per_superblock) {
          __assert_fail("left_b / n_blocks_per_superblock == right_b / n_blocks_per_superblock",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                        ,0x114,
                        "Iterator rmq<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<int *, std::vector<int>>, index_t = unsigned long]"
                       );
        }
        uVar17 = 0x3f;
        if (uVar7 != 0) {
          for (; uVar7 >> uVar17 == 0; uVar17 = uVar17 - 1) {
          }
        }
        if (uVar20 < 2) {
          lVar16 = 0;
          lVar6 = 0;
        }
        else {
          lVar6 = (long)((1 << ((byte)uVar17 & 0x1f)) / 2) * uVar5;
          lVar16 = uVar1 * uVar5;
        }
        lVar22 = *(long *)&(this->block_mins).
                           super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar17 & 0xffffffff].
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data;
        if (piVar9[(ulong)*(ushort *)(lVar22 + (uVar24 - lVar6) * 2) + lVar16] < *_Var19._M_current)
        {
          _Var19._M_current = piVar9 + (ulong)*(ushort *)(lVar22 + (uVar24 - lVar6) * 2) + lVar16;
        }
        if (piVar9[(ulong)*(ushort *)
                           (lVar22 + (uVar11 - ((1 << ((byte)uVar17 & 0x1f)) + lVar6)) * 2) + lVar16
                  ] < *_Var19._M_current) {
          _Var19._M_current =
               piVar9 + (ulong)*(ushort *)
                                (lVar22 + (uVar11 - ((1 << ((byte)uVar17 & 0x1f)) + lVar6)) * 2) +
                        lVar16;
        }
        if (uVar21 < uVar24 * uVar4) {
          piVar8 = piVar9 + uVar24 * uVar4;
          piVar13 = range_begin._M_current + 1;
          _Var15._M_current = range_begin._M_current;
          if (piVar13 != piVar8 && piVar8 != range_begin._M_current) {
            do {
              range_begin._M_current = piVar13;
              if (*_Var15._M_current <= *piVar13) {
                range_begin._M_current = _Var15._M_current;
              }
              piVar13 = piVar13 + 1;
              _Var15._M_current = range_begin._M_current;
            } while (piVar13 != piVar8);
          }
          if (*range_begin._M_current < *_Var19._M_current) {
            _Var19._M_current = range_begin._M_current;
          }
        }
        uVar11 = uVar11 * uVar4;
        if (uVar11 < uVar18) {
          piVar13 = piVar9 + uVar11;
          piVar9 = piVar9 + uVar11 + 1;
          if (piVar9 != range_end._M_current && piVar13 != range_end._M_current) {
            do {
              piVar8 = piVar9;
              if (*piVar13 <= *piVar9) {
                piVar8 = piVar13;
              }
              piVar13 = piVar8;
              piVar9 = piVar9 + 1;
            } while (piVar9 != range_end._M_current);
          }
          if (*piVar13 < *_Var19._M_current) {
            _Var19._M_current = piVar13;
          }
        }
      }
    }
    return (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)_Var19._M_current;
  }
  uVar11 = 0x3f;
  if (uVar5 != 0) {
    for (; uVar5 >> uVar11 == 0; uVar11 = uVar11 - 1) {
    }
  }
  uVar11 = uVar11 & 0xffffffff;
  pvVar2 = (this->superblock_mins).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(this->superblock_mins).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
          -0x5555555555555555;
  if (uVar11 <= uVar5 && uVar5 - uVar11 != 0) {
    lVar6 = *(long *)&pvVar2[uVar11].
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data;
    uVar5 = (long)*(pointer *)
                   ((long)&pvVar2[uVar11].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data + 8) - lVar6 >> 3;
    if (uVar20 < uVar5) {
      uVar11 = uVar4 - (long)(1 << ((byte)uVar11 & 0x1f));
      if (uVar5 <= uVar11) {
        __assert_fail("dist < superblock_mins.size() && right_sb - (1<<dist) < superblock_mins[dist].size()"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                      ,0xcb,
                      "Iterator rmq<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<int *, std::vector<int>>, index_t = unsigned long]"
                     );
      }
      _Var19._M_current = piVar9 + *(long *)(lVar6 + uVar20 * 8);
      if (piVar9[*(long *)(lVar6 + uVar11 * 8)] < piVar9[*(long *)(lVar6 + uVar20 * 8)]) {
        _Var19._M_current = piVar9 + *(long *)(lVar6 + uVar11 * 8);
      }
      goto LAB_00106491;
    }
  }
  __assert_fail("dist < superblock_mins.size() && left_sb < superblock_mins[dist].size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                ,0xc9,
                "Iterator rmq<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<int *, std::vector<int>>, index_t = unsigned long]"
               );
}

Assistant:

Iterator query(Iterator range_begin, Iterator range_end) {
        // find superblocks fully contained within range
        index_t begin_idx = std::distance(_begin, range_begin);
        index_t end_idx = std::distance(_begin, range_end);
        assert(begin_idx < end_idx);
        assert(end_idx <= n);

        // round up to next superblock
        index_t left_sb  = (begin_idx - 1) / superblock_size + 1;
        if (begin_idx == 0)
            left_sb = 0;
        // round down to prev superblock
        index_t right_sb = end_idx / superblock_size;

        // init result
        Iterator min_pos = range_begin;

        // if there is at least one superblock
        if (left_sb < right_sb) {
            // get largest power of two that doesn't exceed the number of
            // superblocks from (left,right)
            index_t n_sb = right_sb - left_sb;
            unsigned int dist = floorlog2(n_sb);

            assert(dist < superblock_mins.size() && left_sb < superblock_mins[dist].size());
            min_pos = _begin + superblock_mins[dist][left_sb];
            assert(dist < superblock_mins.size() && right_sb - (1<<dist) < superblock_mins[dist].size());
            Iterator right_sb_min = _begin + superblock_mins[dist][right_sb - (1 << dist)];
            if (*min_pos > *right_sb_min) {
                min_pos = right_sb_min;
            }
        }

        // go to left -> blocks -> sub-block
        if (left_sb <= right_sb && left_sb != 0 && begin_idx != left_sb*superblock_size) {
            index_t left_b = (begin_idx - 1) / block_size + 1;
            index_t left_b_gidx = left_b * block_size;
            left_b -= (left_sb - 1)*n_blocks_per_superblock;
            index_t n_b = n_blocks_per_superblock - left_b;
            if (n_b > 0) {
                unsigned int level = ceillog2(n_b);
                index_t sb_offset = (left_sb-1)*(n_blocks_per_superblock - (1<<level)/2);
                Iterator block_min_it = _begin + block_mins[level][left_b + sb_offset] + (left_sb-1)*superblock_size;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
            }

            // go left into remaining block, if elements left
            if (left_b_gidx > begin_idx) {
                // linearly search (at most block_size elements)
                Iterator inblock_min_it = std::min_element(range_begin, _begin + left_b_gidx);
                if (*inblock_min_it < *min_pos) {
                    min_pos = inblock_min_it;
                }
            }
        }

        // go to right -> blocks -> sub-block
        if (left_sb <= right_sb && right_sb != n_superblocks && end_idx != right_sb*superblock_size) {
            index_t left_b = right_sb*n_blocks_per_superblock;
            index_t right_b = end_idx / block_size;
            index_t n_b = right_b - left_b;
            if (n_b > 0) {
                unsigned int dist = floorlog2(n_b);
                index_t sb_offset = right_sb*((1<<dist)/2);
                Iterator block_min_it = _begin + block_mins[dist][left_b - sb_offset] + (right_sb)*superblock_size;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
                block_min_it = _begin + block_mins[dist][right_b - sb_offset - (1<<dist)] + (right_sb)*superblock_size;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
            }

            // go right into remaining block, if elements left
            index_t left_gl_idx = right_b*block_size;
            if (left_gl_idx < end_idx) {
                // linearly search (at most block_size elements)
                Iterator inblock_min_it = std::min_element(_begin + left_gl_idx, range_end);
                if (*inblock_min_it < *min_pos) {
                    min_pos = inblock_min_it;
                }
            }
        }

        // if there are no superblocks covered (both indeces in same superblock)
        if (left_sb > right_sb) {
            index_t left_b = (begin_idx - 1) / block_size + 1;
            if (begin_idx == 0)
                left_b = 0;
            index_t right_b = end_idx / block_size;


            if (left_b < right_b) {
                // if blocks are in between: get mins of blocks in range
                // NOTE: there was a while if-else block here to handle the
                //       case if blocks would span accross the boundary of two
                //       superblocks, this should however never happen
                //       git blame this line to find where this code was removed
                // assert blocks lie in the same superblock
                assert(left_b / n_blocks_per_superblock == right_b / n_blocks_per_superblock);

                unsigned int dist = floorlog2(right_b - left_b);
                index_t sb_offset = 0;
                index_t sb_size_offset = 0;
                if (left_sb > 1) {
                    sb_offset = (left_sb-1)*((1<<dist)/2);
                    sb_size_offset = (left_sb-1)*superblock_size;
                }
                Iterator block_min_it = _begin + block_mins[dist][left_b - sb_offset] + sb_size_offset;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
                block_min_it = _begin + block_mins[dist][right_b - sb_offset - (1<<dist)] + sb_size_offset;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;

                // remaining inblock
                if (begin_idx < left_b*block_size) {
                    Iterator inblock_min_it = std::min_element(range_begin, _begin + left_b*block_size);
                    if (*inblock_min_it < *min_pos) {
                        min_pos = inblock_min_it;
                    }
                }
                if (end_idx > right_b*block_size) {
                    Iterator inblock_min_it = std::min_element(_begin + right_b*block_size, range_end);
                    if (*inblock_min_it < *min_pos) {
                        min_pos = inblock_min_it;
                    }
                }
            } else {
                // no blocks at all
                Iterator inblock_min_it = std::min_element(range_begin, range_end);
                if (*inblock_min_it < *min_pos) {
                    min_pos = inblock_min_it;
                }
            }

        }

        // return the minimum found
        return min_pos;
    }